

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring_bitmap_printf_describe(roaring_bitmap_t *r)

{
  byte typecode;
  ushort uVar1;
  container_t *c;
  uint uVar2;
  byte bVar3;
  char *pcVar4;
  long lVar5;
  
  putchar(0x7b);
  lVar5 = 0;
  while( true ) {
    if ((r->high_low_container).size <= lVar5) {
      putchar(0x7d);
      return;
    }
    typecode = (r->high_low_container).typecodes[lVar5];
    if (3 < typecode - 1) break;
    uVar1 = (r->high_low_container).keys[lVar5];
    c = (r->high_low_container).containers[lVar5];
    pcVar4 = "bitset";
    switch((uint)typecode) {
    case 2:
      pcVar4 = "array";
      break;
    case 3:
      pcVar4 = "run";
      break;
    case 4:
      bVar3 = *(char *)((long)c + 8) - 1;
      if (2 < bVar3) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x10dd,"const char *get_full_container_name(const container_t *, uint8_t)");
      }
      pcVar4 = &DAT_0011d100 + *(int *)(&DAT_0011d100 + (ulong)bVar3 * 4);
    }
    uVar2 = container_get_cardinality(c,typecode);
    printf("%d: %s (%d)",(ulong)uVar1,pcVar4,(ulong)uVar2);
    if ((r->high_low_container).typecodes[lVar5] == '\x04') {
      printf("(shared count = %u )",
             (ulong)*(uint *)((long)(r->high_low_container).containers[lVar5] + 0xc));
    }
    if ((int)lVar5 + 1 < (r->high_low_container).size) {
      printf(", ");
    }
    lVar5 = lVar5 + 1;
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                ,0x10e3,"const char *get_full_container_name(const container_t *, uint8_t)");
}

Assistant:

void roaring_bitmap_printf_describe(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        printf("%d: %s (%d)", ra->keys[i],
               get_full_container_name(ra->containers[i], ra->typecodes[i]),
               container_get_cardinality(ra->containers[i], ra->typecodes[i]));

        if (ra->typecodes[i] == SHARED_CONTAINER_TYPE) {
            printf(
                "(shared count = %" PRIu32 " )",
                    CAST_shared(ra->containers[i])->counter);
        }

        if (i + 1 < ra->size) {
            printf(", ");
        }
    }
    printf("}");
}